

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O2

array<double,_4UL> * __thiscall
trento::NucleonCommon::boundary
          (array<double,_4UL> *__return_storage_ptr__,NucleonCommon *this,NucleonData *nucleon)

{
  pointer pCVar1;
  pointer pCVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  
  pCVar1 = (nucleon->constituents_).
           super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pCVar1->x;
  auVar8 = ZEXT1664(auVar7);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pCVar1->y;
  auVar10 = ZEXT1664(auVar9);
  auVar11 = ZEXT1664(auVar9);
  auVar12 = ZEXT1664(auVar7);
LAB_00115777:
  do {
    pCVar2 = pCVar1;
    do {
      pCVar1 = pCVar2 + 1;
      if (pCVar1 == (nucleon->constituents_).
                    super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        dVar3 = this->constituent_radius_sq_;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = dVar3;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          auVar7 = vsqrtsd_avx(auVar6,auVar6);
          dVar3 = auVar7._0_8_;
        }
        __return_storage_ptr__->_M_elems[0] = auVar12._0_8_ - dVar3;
        __return_storage_ptr__->_M_elems[1] = auVar8._0_8_ + dVar3;
        __return_storage_ptr__->_M_elems[2] = auVar11._0_8_ - dVar3;
        __return_storage_ptr__->_M_elems[3] = auVar10._0_8_ + dVar3;
        return __return_storage_ptr__;
      }
      dVar3 = pCVar1->x;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar3;
      if (auVar12._0_8_ <= dVar3) {
        if (auVar8._0_8_ < dVar3) {
          auVar8 = ZEXT1664(auVar4);
        }
      }
      else {
        auVar12 = ZEXT1664(auVar4);
      }
      dVar3 = pCVar2[1].y;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar3;
      if (dVar3 < auVar11._0_8_) {
        auVar11 = ZEXT1664(auVar5);
        goto LAB_00115777;
      }
      pCVar2 = pCVar1;
    } while (dVar3 <= auVar10._0_8_);
    auVar10 = ZEXT1664(auVar5);
  } while( true );
}

Assistant:

inline std::array<double, 4>
NucleonCommon::boundary(const NucleonData& nucleon) const {
  auto constituent = nucleon.constituents_.begin();

  // Initialize the boundary with the position of the first constituent.
  auto xmin = constituent->x, xmax = constituent->x;
  auto ymin = constituent->y, ymax = constituent->y;

  // Check the remaining constituents and update the boundary accordingly.
  // Using this instead of something from std::algorithm because it finds all
  // four quantities {xmin, xmax, ymin, ymax} in a single pass over the constituents.
  for (std::advance(constituent, 1); constituent != nucleon.constituents_.end(); ++constituent) {
    auto x = constituent->x;
    if (x < xmin)
      xmin = x;
    else if (x > xmax)
      xmax = x;

    auto y = constituent->y;
    if (y < ymin)
      ymin = y;
    else if (y > ymax)
      ymax = y;
  }

  // Remember to add and subtract the constituent radius.
  auto r = std::sqrt(constituent_radius_sq_);

  return {xmin - r, xmax + r, ymin - r, ymax + r};
}